

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::GetTargetFlags
          (cmLocalGenerator *this,string *linkLibs,string *flags,string *linkFlags,
          string *frameworkPath,string *linkPath,cmGeneratorTarget *target,bool useWatcomQuote)

{
  cmMakefile *pcVar1;
  bool bVar2;
  TargetType TVar3;
  char *pcVar4;
  ulong uVar5;
  reference ppcVar6;
  string *psVar7;
  bool local_52a;
  byte local_512;
  allocator local_481;
  undefined1 local_480 [8];
  string configLinkFlags_1;
  string local_458;
  char *local_438;
  char *targetLinkFlags_1;
  undefined1 local_428 [8];
  string exportFlagVar;
  string local_400;
  allocator local_3d9;
  string local_3d8;
  allocator local_3b1;
  string local_3b0;
  allocator local_389;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  allocator local_361;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  undefined1 local_320 [8];
  string sFlagVar;
  string local_2f8;
  int local_2d4;
  undefined1 local_2d0 [8];
  string linkLanguage;
  undefined1 local_2a8 [8];
  string build_1;
  string local_280;
  allocator local_259;
  undefined1 local_258 [8];
  string configLinkFlags;
  string local_230;
  char *local_210;
  char *targetLinkFlags;
  allocator local_1e1;
  string local_1e0;
  cmSourceFile *local_1c0;
  cmSourceFile *sf;
  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_1b0;
  __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_1a8;
  const_iterator i;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  string local_180;
  byte local_15b;
  byte local_15a;
  allocator local_159;
  string local_158;
  allocator local_131;
  string local_130;
  allocator local_109;
  undefined1 local_108 [8];
  string build;
  string local_e0;
  char *local_c0;
  char *libraryLinkVariable;
  allocator local_95 [20];
  allocator local_81;
  string local_80;
  undefined1 local_60 [8];
  string buildType;
  bool useWatcomQuote_local;
  string *linkPath_local;
  string *frameworkPath_local;
  string *linkFlags_local;
  string *flags_local;
  string *linkLibs_local;
  cmLocalGenerator *this_local;
  
  buildType.field_2._M_local_buf[0xf] = useWatcomQuote;
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"CMAKE_BUILD_TYPE",&local_81);
  pcVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_60,pcVar4,local_95);
  std::allocator<char>::~allocator((allocator<char> *)local_95);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  cmsys::SystemTools::UpperCase((string *)&libraryLinkVariable,(string *)local_60);
  std::__cxx11::string::operator=((string *)local_60,(string *)&libraryLinkVariable);
  std::__cxx11::string::~string((string *)&libraryLinkVariable);
  local_c0 = "CMAKE_SHARED_LINKER_FLAGS";
  TVar3 = cmGeneratorTarget::GetType(target);
  switch(TVar3) {
  case EXECUTABLE:
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_280,"CMAKE_EXE_LINKER_FLAGS",
               (allocator *)(build_1.field_2._M_local_buf + 0xf));
    pcVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_280);
    std::__cxx11::string::operator+=((string *)linkFlags,pcVar4);
    std::__cxx11::string::~string((string *)&local_280);
    std::allocator<char>::~allocator((allocator<char> *)(build_1.field_2._M_local_buf + 0xf));
    std::__cxx11::string::operator+=((string *)linkFlags," ");
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_2a8,"CMAKE_EXE_LINKER_FLAGS_",
                 (allocator *)(linkLanguage.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(linkLanguage.field_2._M_local_buf + 0xf))
      ;
      std::__cxx11::string::operator+=((string *)local_2a8,(string *)local_60);
      pcVar4 = cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_2a8);
      std::__cxx11::string::operator+=((string *)linkFlags,pcVar4);
      std::__cxx11::string::operator+=((string *)linkFlags," ");
      std::__cxx11::string::~string((string *)local_2a8);
    }
    cmGeneratorTarget::GetLinkerLanguage((string *)local_2d0,target,(string *)local_60);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      AddLanguageFlags(this,flags,(string *)local_2d0,(string *)local_60);
      OutputLinkLibraries(this,linkLibs,frameworkPath,linkPath,target,false,false,
                          (bool)(buildType.field_2._M_local_buf[0xf] & 1));
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_2f8,"BUILD_SHARED_LIBS",
                 (allocator *)(sFlagVar.field_2._M_local_buf + 0xf));
      pcVar4 = cmMakefile::GetDefinition(pcVar1,&local_2f8);
      bVar2 = cmSystemTools::IsOn(pcVar4);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::allocator<char>::~allocator((allocator<char> *)(sFlagVar.field_2._M_local_buf + 0xf));
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_360,"CMAKE_SHARED_BUILD_",&local_361);
        std::operator+(&local_340,&local_360,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2d0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_388,"_FLAGS",&local_389);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_320,&local_340,&local_388);
        std::__cxx11::string::~string((string *)&local_388);
        std::allocator<char>::~allocator((allocator<char> *)&local_389);
        std::__cxx11::string::~string((string *)&local_340);
        std::__cxx11::string::~string((string *)&local_360);
        std::allocator<char>::~allocator((allocator<char> *)&local_361);
        pcVar4 = cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_320);
        std::__cxx11::string::operator+=((string *)linkFlags,pcVar4);
        std::__cxx11::string::operator+=((string *)linkFlags," ");
        std::__cxx11::string::~string((string *)local_320);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3b0,"WIN32_EXECUTABLE",&local_3b1);
      bVar2 = cmGeneratorTarget::GetPropertyAsBool(target,&local_3b0);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
      if (bVar2) {
        pcVar1 = this->Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_3d8,"CMAKE_CREATE_WIN32_EXE",&local_3d9);
        pcVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_3d8);
        std::__cxx11::string::operator+=((string *)linkFlags,pcVar4);
        std::__cxx11::string::~string((string *)&local_3d8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
        std::__cxx11::string::operator+=((string *)linkFlags," ");
      }
      else {
        pcVar1 = this->Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_400,"CMAKE_CREATE_CONSOLE_EXE",
                   (allocator *)(exportFlagVar.field_2._M_local_buf + 0xf));
        pcVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_400);
        std::__cxx11::string::operator+=((string *)linkFlags,pcVar4);
        std::__cxx11::string::~string((string *)&local_400);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(exportFlagVar.field_2._M_local_buf + 0xf));
        std::__cxx11::string::operator+=((string *)linkFlags," ");
      }
      bVar2 = cmGeneratorTarget::IsExecutableWithExports(target);
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_428,"CMAKE_EXE_EXPORTS_",
                   (allocator *)((long)&targetLinkFlags_1 + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&targetLinkFlags_1 + 7));
        std::__cxx11::string::operator+=((string *)local_428,(string *)local_2d0);
        std::__cxx11::string::operator+=((string *)local_428,"_FLAG");
        pcVar4 = cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_428);
        std::__cxx11::string::operator+=((string *)linkFlags,pcVar4);
        std::__cxx11::string::operator+=((string *)linkFlags," ");
        std::__cxx11::string::~string((string *)local_428);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_458,"LINK_FLAGS",
                 (allocator *)(configLinkFlags_1.field_2._M_local_buf + 0xf));
      pcVar4 = cmGeneratorTarget::GetProperty(target,&local_458);
      std::__cxx11::string::~string((string *)&local_458);
      std::allocator<char>::~allocator
                ((allocator<char> *)(configLinkFlags_1.field_2._M_local_buf + 0xf));
      local_438 = pcVar4;
      if (pcVar4 != (char *)0x0) {
        std::__cxx11::string::operator+=((string *)linkFlags,pcVar4);
        std::__cxx11::string::operator+=((string *)linkFlags," ");
      }
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_480,"LINK_FLAGS_",&local_481);
        std::allocator<char>::~allocator((allocator<char> *)&local_481);
        std::__cxx11::string::operator+=((string *)local_480,(string *)local_60);
        local_438 = cmGeneratorTarget::GetProperty(target,(string *)local_480);
        if (local_438 != (char *)0x0) {
          std::__cxx11::string::operator+=((string *)linkFlags,local_438);
          std::__cxx11::string::operator+=((string *)linkFlags," ");
        }
        std::__cxx11::string::~string((string *)local_480);
      }
      local_2d4 = 0;
    }
    else {
      cmGeneratorTarget::GetName_abi_cxx11_(target);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::Error
                ("CMake can not determine linker language for target: ",pcVar4,(char *)0x0,
                 (char *)0x0);
      local_2d4 = 1;
    }
    std::__cxx11::string::~string((string *)local_2d0);
    if (local_2d4 != 0) goto LAB_006b3d75;
    break;
  case STATIC_LIBRARY:
    GetStaticLibraryFlags(this,linkFlags,(string *)local_60,target);
    break;
  case MODULE_LIBRARY:
    local_c0 = "CMAKE_MODULE_LINKER_FLAGS";
  case SHARED_LIBRARY:
    pcVar4 = local_c0;
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_e0,pcVar4,(allocator *)(build.field_2._M_local_buf + 0xf));
    pcVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_e0);
    std::__cxx11::string::operator=((string *)linkFlags,pcVar4);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator((allocator<char> *)(build.field_2._M_local_buf + 0xf));
    std::__cxx11::string::operator+=((string *)linkFlags," ");
    uVar5 = std::__cxx11::string::empty();
    pcVar4 = local_c0;
    if ((uVar5 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_108,pcVar4,&local_109);
      std::allocator<char>::~allocator((allocator<char> *)&local_109);
      std::__cxx11::string::operator+=((string *)local_108,"_");
      std::__cxx11::string::operator+=((string *)local_108,(string *)local_60);
      pcVar4 = cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_108);
      std::__cxx11::string::operator+=((string *)linkFlags,pcVar4);
      std::__cxx11::string::operator+=((string *)linkFlags," ");
      std::__cxx11::string::~string((string *)local_108);
    }
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    local_15a = 0;
    local_15b = 0;
    sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
    std::__cxx11::string::string((string *)&local_130,"WIN32",&local_131);
    bVar2 = cmMakefile::IsOn(pcVar1,&local_130);
    local_512 = 0;
    if (bVar2) {
      pcVar1 = this->Makefile;
      std::allocator<char>::allocator();
      local_15a = 1;
      std::__cxx11::string::string((string *)&local_158,"CYGWIN",&local_159);
      local_15b = 1;
      bVar2 = cmMakefile::IsOn(pcVar1,&local_158);
      local_52a = true;
      if (!bVar2) {
        pcVar1 = this->Makefile;
        std::allocator<char>::allocator();
        sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
        std::__cxx11::string::string
                  ((string *)&local_180,"MINGW",
                   (allocator *)
                   ((long)&sources.
                           super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
        local_52a = cmMakefile::IsOn(pcVar1,&local_180);
      }
      local_512 = local_52a ^ 0xff;
    }
    if ((sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._5_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_180);
    }
    if ((sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0) {
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    }
    if ((local_15b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_158);
    }
    if ((local_15a & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_159);
    }
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
    if ((local_512 & 1) != 0) {
      std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector
                ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&i);
      cmGeneratorTarget::GetSourceFiles
                (target,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&i,
                 (string *)local_60);
      local_1b0._M_current =
           (cmSourceFile **)
           std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                     ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&i);
      __gnu_cxx::
      __normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
      ::__normal_iterator<cmSourceFile**>
                ((__normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
                  *)&local_1a8,&local_1b0);
      while( true ) {
        sf = (cmSourceFile *)
             std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                       ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&i);
        bVar2 = __gnu_cxx::operator!=
                          (&local_1a8,
                           (__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                            *)&sf);
        if (!bVar2) break;
        ppcVar6 = __gnu_cxx::
                  __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                  ::operator*(&local_1a8);
        local_1c0 = *ppcVar6;
        psVar7 = cmSourceFile::GetExtension_abi_cxx11_(local_1c0);
        bVar2 = std::operator==(psVar7,"def");
        if (bVar2) {
          pcVar1 = this->Makefile;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_1e0,"CMAKE_LINK_DEF_FILE_FLAG",&local_1e1);
          pcVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_1e0);
          std::__cxx11::string::operator+=((string *)linkFlags,pcVar4);
          std::__cxx11::string::~string((string *)&local_1e0);
          std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
          psVar7 = cmSourceFile::GetFullPath(local_1c0,(string *)0x0);
          cmOutputConverter::Convert
                    ((string *)&targetLinkFlags,&this->super_cmOutputConverter,psVar7,FULL,SHELL);
          std::__cxx11::string::operator+=((string *)linkFlags,(string *)&targetLinkFlags);
          std::__cxx11::string::~string((string *)&targetLinkFlags);
          std::__cxx11::string::operator+=((string *)linkFlags," ");
        }
        __gnu_cxx::
        __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
        ::operator++(&local_1a8);
      }
      std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
                ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&i);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_230,"LINK_FLAGS",
               (allocator *)(configLinkFlags.field_2._M_local_buf + 0xf));
    pcVar4 = cmGeneratorTarget::GetProperty(target,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator
              ((allocator<char> *)(configLinkFlags.field_2._M_local_buf + 0xf));
    local_210 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::string::operator+=((string *)linkFlags,pcVar4);
      std::__cxx11::string::operator+=((string *)linkFlags," ");
    }
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_258,"LINK_FLAGS_",&local_259);
      std::allocator<char>::~allocator((allocator<char> *)&local_259);
      std::__cxx11::string::operator+=((string *)local_258,(string *)local_60);
      local_210 = cmGeneratorTarget::GetProperty(target,(string *)local_258);
      if (local_210 != (char *)0x0) {
        std::__cxx11::string::operator+=((string *)linkFlags,local_210);
        std::__cxx11::string::operator+=((string *)linkFlags," ");
      }
      std::__cxx11::string::~string((string *)local_258);
    }
    OutputLinkLibraries(this,linkLibs,frameworkPath,linkPath,target,false,false,
                        (bool)(buildType.field_2._M_local_buf[0xf] & 1));
  }
  local_2d4 = 0;
LAB_006b3d75:
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

void cmLocalGenerator::GetTargetFlags(std::string& linkLibs,
                                 std::string& flags,
                                 std::string& linkFlags,
                                 std::string& frameworkPath,
                                 std::string& linkPath,
                                 cmGeneratorTarget* target,
                                 bool useWatcomQuote)
{
  std::string buildType =
    this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
  buildType = cmSystemTools::UpperCase(buildType);
  const char* libraryLinkVariable =
    "CMAKE_SHARED_LINKER_FLAGS"; // default to shared library

  switch(target->GetType())
    {
    case cmState::STATIC_LIBRARY:
      this->GetStaticLibraryFlags(linkFlags, buildType, target);
      break;
    case cmState::MODULE_LIBRARY:
      libraryLinkVariable = "CMAKE_MODULE_LINKER_FLAGS";
    case cmState::SHARED_LIBRARY:
      {
      linkFlags = this->Makefile->GetSafeDefinition(libraryLinkVariable);
      linkFlags += " ";
      if(!buildType.empty())
        {
        std::string build = libraryLinkVariable;
        build += "_";
        build += buildType;
        linkFlags += this->Makefile->GetSafeDefinition(build);
        linkFlags += " ";
        }
      if(this->Makefile->IsOn("WIN32") &&
         !(this->Makefile->IsOn("CYGWIN") || this->Makefile->IsOn("MINGW")))
        {
        std::vector<cmSourceFile*> sources;
        target->GetSourceFiles(sources, buildType);
        for(std::vector<cmSourceFile*>::const_iterator i = sources.begin();
            i != sources.end(); ++i)
          {
          cmSourceFile* sf = *i;
          if(sf->GetExtension() == "def")
            {
            linkFlags +=
              this->Makefile->GetSafeDefinition("CMAKE_LINK_DEF_FILE_FLAG");
            linkFlags += this->Convert(sf->GetFullPath(),
                                       FULL, SHELL);
            linkFlags += " ";
            }
          }
        }
      const char* targetLinkFlags = target->GetProperty("LINK_FLAGS");
      if(targetLinkFlags)
        {
        linkFlags += targetLinkFlags;
        linkFlags += " ";
        }
      if(!buildType.empty())
        {
        std::string configLinkFlags = "LINK_FLAGS_";
        configLinkFlags += buildType;
        targetLinkFlags = target->GetProperty(configLinkFlags);
        if(targetLinkFlags)
          {
          linkFlags += targetLinkFlags;
          linkFlags += " ";
          }
        }
      this->OutputLinkLibraries(linkLibs, frameworkPath, linkPath,
                                *target, false, false, useWatcomQuote);
      }
      break;
    case cmState::EXECUTABLE:
      {
      linkFlags +=
        this->Makefile->GetSafeDefinition("CMAKE_EXE_LINKER_FLAGS");
      linkFlags += " ";
      if(!buildType.empty())
        {
        std::string build = "CMAKE_EXE_LINKER_FLAGS_";
        build += buildType;
        linkFlags += this->Makefile->GetSafeDefinition(build);
        linkFlags += " ";
        }
      std::string linkLanguage = target->GetLinkerLanguage(buildType);
      if(linkLanguage.empty())
        {
        cmSystemTools::Error
          ("CMake can not determine linker language for target: ",
           target->GetName().c_str());
        return;
        }
      this->AddLanguageFlags(flags, linkLanguage, buildType);
      this->OutputLinkLibraries(linkLibs, frameworkPath, linkPath,
                                *target, false, false, useWatcomQuote);
      if(cmSystemTools::IsOn
         (this->Makefile->GetDefinition("BUILD_SHARED_LIBS")))
        {
        std::string sFlagVar = std::string("CMAKE_SHARED_BUILD_")
          + linkLanguage + std::string("_FLAGS");
        linkFlags += this->Makefile->GetSafeDefinition(sFlagVar);
        linkFlags += " ";
        }
      if ( target->GetPropertyAsBool("WIN32_EXECUTABLE") )
        {
        linkFlags +=
          this->Makefile->GetSafeDefinition("CMAKE_CREATE_WIN32_EXE");
        linkFlags += " ";
        }
      else
        {
        linkFlags +=
          this->Makefile->GetSafeDefinition("CMAKE_CREATE_CONSOLE_EXE");
        linkFlags += " ";
        }
      if (target->IsExecutableWithExports())
        {
        std::string exportFlagVar = "CMAKE_EXE_EXPORTS_";
        exportFlagVar += linkLanguage;
        exportFlagVar += "_FLAG";

        linkFlags +=
          this->Makefile->GetSafeDefinition(exportFlagVar);
        linkFlags += " ";
        }
      const char* targetLinkFlags = target->GetProperty("LINK_FLAGS");
      if(targetLinkFlags)
        {
        linkFlags += targetLinkFlags;
        linkFlags += " ";
        }
      if(!buildType.empty())
        {
        std::string configLinkFlags = "LINK_FLAGS_";
        configLinkFlags += buildType;
        targetLinkFlags = target->GetProperty(configLinkFlags);
        if(targetLinkFlags)
          {
          linkFlags += targetLinkFlags;
          linkFlags += " ";
          }
        }
      }
      break;
    default:
      break;
    }
}